

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::DumpObjectDescription(Recycler *this,void *objectAddress)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  TrackerData *pTVar4;
  type_info *typeinfo;
  undefined8 *in_FS_OFFSET;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    pTVar4 = GetTrackerData(this,objectAddress);
    if (pTVar4 != (TrackerData *)0x0) {
      typeinfo = pTVar4->typeinfo;
      bVar3 = pTVar4->isArray;
      goto LAB_002923a9;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1f72,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  bVar3 = false;
  typeinfo = (type_info *)0x0;
LAB_002923a9:
  RecyclerObjectDumper::DumpObject(typeinfo,bVar3,objectAddress);
  return;
}

Assistant:

void
Recycler::DumpObjectDescription(void *objectAddress)
{
#ifdef PROFILE_RECYCLER_ALLOC
    type_info const * typeinfo = nullptr;
    bool isArray = false;

    if (this->trackerDictionary)
    {
        TrackerData * trackerData = GetTrackerData(objectAddress);
        if (trackerData != nullptr)
        {
            typeinfo = trackerData->typeinfo;
            isArray = trackerData->isArray;
        }
        else
        {
            Assert(false);
        }
    }
    RecyclerObjectDumper::DumpObject(typeinfo, isArray, objectAddress);
#else
    Output::Print(_u("Address %p"), objectAddress);
#endif
}